

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O0

void __thiscall
VSInterface::VSInDelegator::Read
          (VSInDelegator *this,char *name,vector<long,_std::allocator<long>_> *output)

{
  vector<long,_std::allocator<long>_> *this_00;
  int64_t local_30;
  int local_28;
  int local_24;
  int i;
  int size;
  vector<long,_std::allocator<long>_> *output_local;
  char *name_local;
  VSInDelegator *this_local;
  
  _i = output;
  output_local = (vector<long,_std::allocator<long>_> *)name;
  name_local = (char *)this;
  local_24 = (*this->_vsapi->propNumElements)(this->_in,name);
  if (-1 < local_24) {
    std::vector<long,_std::allocator<long>_>::clear(_i);
    for (local_28 = 0; this_00 = _i, local_28 < local_24; local_28 = local_28 + 1) {
      local_30 = (*this->_vsapi->propGetInt)(this->_in,(char *)output_local,local_28,&this->_err);
      std::vector<long,_std::allocator<long>_>::push_back(this_00,&local_30);
    }
  }
  return;
}

Assistant:

void Read(const char* name, std::vector<int64_t>& output) override {
      auto size = _vsapi->propNumElements(_in, name);
      if (size < 0) return;
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(_vsapi->propGetInt(_in, name, i, &_err));
    }